

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O3

void __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::EmitCodeBlock
          (LuaBfbsGenerator *this,string *code_block,string *name,string *ns,string *declaring_file)

{
  _Rb_tree_header *p_Var1;
  Schema *pSVar2;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  string *psVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  undefined8 *puVar9;
  ulong uVar10;
  size_type *psVar11;
  long *plVar12;
  ulong *puVar13;
  char *pcVar14;
  undefined8 uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  string path;
  string file_name;
  string code;
  string full_qualified_name;
  string root_file;
  string root_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  long *local_110;
  size_t local_108;
  long local_100;
  long lStack_f8;
  LuaBfbsGenerator *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  long *local_88 [2];
  long local_78 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string *local_48;
  string *local_40;
  string *local_38;
  
  pSVar2 = (this->super_BaseBfbsGenerator).schema_;
  uVar10 = (ulong)*(ushort *)(pSVar2 + (0xc - (long)*(int *)pSVar2));
  lVar4 = *(uint *)(pSVar2 + uVar10) + uVar10;
  lVar5 = (ulong)*(ushort *)
                  (pSVar2 + (lVar4 - *(int *)(pSVar2 + *(uint *)(pSVar2 + uVar10) + uVar10)) + 4) +
          lVar4;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_38 = code_block;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             pSVar2 + (ulong)*(uint *)(pSVar2 + (ulong)*(ushort *)
                                                        (pSVar2 + (lVar4 - *(int *)(pSVar2 + *(uint 
                                                  *)(pSVar2 + uVar10) + uVar10)) + 4) + lVar4) + 4 +
                      lVar5,
             pSVar2 + (ulong)*(uint *)(pSVar2 + (ulong)*(uint *)(pSVar2 + (ulong)*(ushort *)
                                                                                  (pSVar2 + (lVar4 -
                                                                                            *(int *)
                                                  (pSVar2 + *(uint *)(pSVar2 + uVar10) + uVar10)) +
                                                  4) + lVar4) + 4 + lVar5 + -4) +
                      (ulong)*(uint *)(pSVar2 + (ulong)*(ushort *)
                                                        (pSVar2 + (lVar4 - *(int *)(pSVar2 + *(uint 
                                                  *)(pSVar2 + uVar10) + uVar10)) + 4) + lVar4) +
                      lVar5 + 4);
  pSVar2 = (this->super_BaseBfbsGenerator).schema_;
  uVar10 = (ulong)*(ushort *)(pSVar2 + (0xc - (long)*(int *)pSVar2));
  lVar4 = *(uint *)(pSVar2 + uVar10) + uVar10;
  lVar5 = (ulong)*(ushort *)
                  (pSVar2 + (lVar4 - *(int *)(pSVar2 + *(uint *)(pSVar2 + uVar10) + uVar10)) + 0x12)
          + lVar4;
  local_88[0] = local_78;
  local_f0 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,
             pSVar2 + (ulong)*(uint *)(pSVar2 + (ulong)*(ushort *)
                                                        (pSVar2 + (lVar4 - *(int *)(pSVar2 + *(uint 
                                                  *)(pSVar2 + uVar10) + uVar10)) + 0x12) + lVar4) +
                      4 + lVar5,
             pSVar2 + (ulong)*(uint *)(pSVar2 + (ulong)*(uint *)(pSVar2 + (ulong)*(ushort *)
                                                                                  (pSVar2 + (lVar4 -
                                                                                            *(int *)
                                                  (pSVar2 + *(uint *)(pSVar2 + uVar10) + uVar10)) +
                                                  0x12) + lVar4) + 4 + lVar5 + -4) +
                      (ulong)*(uint *)(pSVar2 + (ulong)*(ushort *)
                                                        (pSVar2 + (lVar4 - *(int *)(pSVar2 + *(uint 
                                                  *)(pSVar2 + uVar10) + uVar10)) + 0x12) + lVar4) +
                      lVar5 + 4);
  if (ns->_M_string_length == 0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    pcVar3 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar3,pcVar3 + name->_M_string_length);
  }
  else {
    pcVar3 = (ns->_M_dataplus)._M_p;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + ns->_M_string_length);
    std::__cxx11::string::append((char *)&local_110);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)(name->_M_dataplus)._M_p);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_c8.field_2._M_allocated_capacity = *psVar11;
      local_c8.field_2._8_8_ = plVar7[3];
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar11;
      local_c8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_c8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
  }
  std::operator+(&local_170,"--[[ ",&local_c8);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_170);
  local_110 = &local_100;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_100 = *plVar12;
    lStack_f8 = plVar7[3];
  }
  else {
    local_100 = *plVar12;
    local_110 = (long *)*plVar7;
  }
  local_108 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  paVar16 = &local_170.field_2;
  local_40 = ns;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar16) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_110);
  std::__cxx11::string::append((char *)&local_110);
  std::__cxx11::string::append((char *)&local_110);
  std::operator+(&local_150,"  flatc version: ",&local_f0->flatc_version_);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_150);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170.field_2._8_8_ = plVar7[3];
    local_170._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_170._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_170._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar16) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_110);
  std::operator+(&local_150,"  Declared by  : ",declaring_file);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_150);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170.field_2._8_8_ = plVar7[3];
    local_170._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_170._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_170._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar16) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_e8,"  Rooting type : ",&local_68);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
  puVar13 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar13) {
    local_120 = *puVar13;
    lStack_118 = plVar7[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar13;
    local_130 = (ulong *)*plVar7;
  }
  local_128 = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_88[0]);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_150.field_2._M_allocated_capacity = *psVar11;
    local_150.field_2._8_8_ = plVar7[3];
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar11;
    local_150._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_150._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_150);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170.field_2._8_8_ = plVar7[3];
    local_170._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_170._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_170._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar16) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_110);
  if ((local_f0->requires_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var8 = (local_f0->requires_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(local_f0->requires_)._M_t._M_impl.super__Rb_tree_header;
    local_48 = name;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      do {
        std::operator+(&local_e8,"local ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var8 + 1));
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_130 = &local_120;
        puVar13 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar13) {
          local_120 = *puVar13;
          lStack_118 = plVar7[3];
        }
        else {
          local_120 = *puVar13;
          local_130 = (ulong *)*plVar7;
        }
        local_128 = plVar7[1];
        *plVar7 = (long)puVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_130,*(ulong *)(p_Var8 + 2));
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150.field_2._8_8_ = plVar7[3];
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_150._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_170.field_2._M_allocated_capacity = *psVar11;
          local_170.field_2._8_8_ = plVar7[3];
        }
        else {
          local_170.field_2._M_allocated_capacity = *psVar11;
          local_170._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_170._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_170._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
    std::__cxx11::string::append((char *)&local_110);
    name = local_48;
  }
  paVar16 = &local_170.field_2;
  std::__cxx11::string::_M_append((char *)&local_110,(ulong)(local_38->_M_dataplus)._M_p);
  std::operator+(&local_170,"return ",name);
  std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_170._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar16) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  psVar6 = local_40;
  pcVar3 = (local_40->_M_dataplus)._M_p;
  local_170._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar3,pcVar3 + local_40->_M_string_length);
  if (psVar6->_M_string_length == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_170,0,(char *)local_170._M_string_length,0x37c2d8);
  }
  else if ((char *)local_170._M_string_length != (char *)0x0) {
    pcVar14 = (char *)0x0;
    do {
      if (local_170._M_dataplus._M_p[(long)pcVar14] == '.') {
        local_170._M_dataplus._M_p[(long)pcVar14] = '/';
      }
      pcVar14 = pcVar14 + 1;
    } while ((char *)local_170._M_string_length != pcVar14);
  }
  EnsureDirExists(&local_170);
  std::operator+(&local_e8,&(local_f0->options_).output_path,&local_170);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
  puVar13 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar13) {
    local_120 = *puVar13;
    lStack_118 = plVar7[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar13;
    local_130 = (ulong *)*plVar7;
  }
  local_128 = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  Namer::File(&local_a8,&(local_f0->namer_).super_Namer,name,None);
  uVar10 = 0xf;
  if (local_130 != &local_120) {
    uVar10 = local_120;
  }
  if (uVar10 < local_a8._M_string_length + local_128) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      uVar15 = local_a8.field_2._M_allocated_capacity;
    }
    if (local_a8._M_string_length + local_128 <= (ulong)uVar15) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_130);
      goto LAB_0031ebaf;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_a8._M_dataplus._M_p);
LAB_0031ebaf:
  psVar11 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_150.field_2._M_allocated_capacity = *psVar11;
    local_150.field_2._8_8_ = puVar9[3];
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar11;
    local_150._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_150._M_string_length = puVar9[1];
  *puVar9 = psVar11;
  puVar9[1] = 0;
  *(undefined1 *)psVar11 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  SaveFile(local_150._M_dataplus._M_p,(char *)local_110,local_108,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar16) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void EmitCodeBlock(const std::string &code_block, const std::string &name,
                     const std::string &ns,
                     const std::string &declaring_file) const {
    const std::string root_type = schema_->root_table()->name()->str();
    const std::string root_file =
        schema_->root_table()->declaration_file()->str();
    const std::string full_qualified_name = ns.empty() ? name : ns + "." + name;

    std::string code = "--[[ " + full_qualified_name + "\n\n";
    code +=
        "  Automatically generated by the FlatBuffers compiler, do not "
        "modify.\n";
    code += "  Or modify. I'm a message, not a cop.\n";
    code += "\n";
    code += "  flatc version: " + flatc_version_ + "\n";
    code += "\n";
    code += "  Declared by  : " + declaring_file + "\n";
    code += "  Rooting type : " + root_type + " (" + root_file + ")\n";
    code += "\n--]]\n\n";

    if (!requires_.empty()) {
      for (auto it = requires_.cbegin(); it != requires_.cend(); ++it) {
        code += "local " + it->first + " = require('" + it->second + "')\n";
      }
      code += "\n";
    }

    code += code_block;
    code += "return " + name;

    // Namespaces are '.' deliminted, so replace it with the path separator.
    std::string path = ns;

    if (ns.empty()) {
      path = ".";
    } else {
      std::replace(path.begin(), path.end(), '.', '/');
    }

    // TODO(derekbailey): figure out a save file without depending on util.h
    EnsureDirExists(path);
    const std::string file_name =
        options_.output_path + path + "/" + namer_.File(name);
    SaveFile(file_name.c_str(), code, false);
  }